

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_encoded_map_size
              (AMQP_MAP_KEY_VALUE_PAIR *pairs,uint32_t count,uint32_t *encoded_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t item_size;
  LOGGER_LOG l;
  ulong uStack_28;
  int result;
  size_t i;
  uint32_t *encoded_size_local;
  AMQP_MAP_KEY_VALUE_PAIR *pAStack_10;
  uint32_t count_local;
  AMQP_MAP_KEY_VALUE_PAIR *pairs_local;
  
  i = (size_t)encoded_size;
  encoded_size_local._4_4_ = count;
  pAStack_10 = pairs;
  if (encoded_size == (uint32_t *)0x0) {
    item_size = (size_t)xlogging_get_log_function();
    if ((LOGGER_LOG)item_size != (LOGGER_LOG)0x0) {
      (*(code *)item_size)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                 ,"amqpvalue_get_encoded_map_size",0xf82,1,"Bad arguments: encoded_size = %p",i);
    }
    l._4_4_ = 0xf83;
  }
  else {
    *encoded_size = 0;
    for (uStack_28 = 0; uStack_28 < encoded_size_local._4_4_; uStack_28 = uStack_28 + 1) {
      iVar1 = amqpvalue_get_encoded_size(pAStack_10[uStack_28].key,(size_t *)&l_1);
      uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_map_size",0xf8f,1,
                    "Could not get encoded size for key element %u of the map",
                    CONCAT44(uVar3,(int)uStack_28));
        }
        break;
      }
      if (((LOGGER_LOG)0xffffffff < l_1) || ((uint)(*(int *)i + (int)l_1) < *(uint *)i)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_map_size",0xf96,1,
                    "Encoded data is more than the max size for a map");
        }
        break;
      }
      *(int *)i = *(int *)i + (int)l_1;
      iVar1 = amqpvalue_get_encoded_size(pAStack_10[uStack_28].value,(size_t *)&l_1);
      uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_map_size",0xf9e,1,
                    "Could not get encoded size for value element %u of the map",
                    CONCAT44(uVar3,(int)uStack_28));
        }
        break;
      }
      if (((LOGGER_LOG)0xffffffff < l_1) || ((uint)(*(int *)i + (int)l_1) < *(uint *)i)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_encoded_map_size",0xfa5,1,
                    "Encoded data is more than the max size for a map");
        }
        break;
      }
      *(int *)i = *(int *)i + (int)l_1;
    }
    if (uStack_28 < encoded_size_local._4_4_) {
      l._4_4_ = 0xfae;
    }
    else {
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

static int amqpvalue_get_encoded_map_size(AMQP_MAP_KEY_VALUE_PAIR* pairs, uint32_t count, uint32_t* encoded_size)
{
    size_t i;
    int result;

    if (encoded_size == NULL)
    {
        LogError("Bad arguments: encoded_size = %p", encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;

        /* Get the size of all items in the map */
        for (i = 0; i < count; i++)
        {
            size_t item_size;
            if (amqpvalue_get_encoded_size(pairs[i].key, &item_size) != 0)
            {
                LogError("Could not get encoded size for key element %u of the map", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Encoded data is more than the max size for a map");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);

            if (amqpvalue_get_encoded_size(pairs[i].value, &item_size) != 0)
            {
                LogError("Could not get encoded size for value element %u of the map", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Encoded data is more than the max size for a map");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);
        }

        if (i < count)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}